

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O2

void xmlErrValid(xmlValidCtxtPtr ctxt,xmlParserErrors error,char *msg,char *extra)

{
  void *ctx;
  void *data;
  xmlGenericErrorFunc channel;
  char *msg_00;
  char *pcVar1;
  
  if (ctxt == (xmlValidCtxtPtr)0x0) {
    ctx = (void *)0x0;
    data = (void *)0x0;
    channel = (xmlGenericErrorFunc)0x0;
  }
  else {
    data = ctxt->userData;
    channel = ctxt->error;
    if ((ctxt->flags & 2) == 0) {
      ctx = (void *)0x0;
    }
    else {
      ctx = (void *)0x0;
      if (0xffffffffffffff06 < (ulong)((long)data - (long)ctxt)) {
        ctx = data;
      }
    }
  }
  msg_00 = msg;
  pcVar1 = extra;
  if (extra == (char *)0x0) {
    extra = (char *)0x0;
    msg_00 = "%s";
    pcVar1 = msg;
  }
  __xmlRaiseError((xmlStructuredErrorFunc)0x0,channel,data,ctx,(void *)0x0,0x17,error,XML_ERR_ERROR,
                  (char *)0x0,0,extra,(char *)0x0,(char *)0x0,0,0,msg_00,pcVar1);
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(3,0)
xmlErrValid(xmlParserCtxtPtr ctxt, xmlParserErrors error,
            const char *msg, const char *str1, const char *str2)
{
    xmlStructuredErrorFunc schannel = NULL;

    if ((ctxt != NULL) && (ctxt->disableSAX != 0) &&
        (ctxt->instate == XML_PARSER_EOF))
	return;
    if (ctxt != NULL) {
	ctxt->errNo = error;
	if ((ctxt->sax != NULL) && (ctxt->sax->initialized == XML_SAX2_MAGIC))
	    schannel = ctxt->sax->serror;
	__xmlRaiseError(schannel,
			ctxt->vctxt.error, ctxt->vctxt.userData,
			ctxt, NULL, XML_FROM_DTD, error,
			XML_ERR_ERROR, NULL, 0, (const char *) str1,
			(const char *) str2, NULL, 0, 0,
			msg, (const char *) str1, (const char *) str2);
	ctxt->valid = 0;
    }